

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool __thiscall ghc::filesystem::path::has_relative_path(path *this)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  
  if (((((this->_path)._M_string_length < 3) ||
       (pcVar1 = (this->_path)._M_dataplus._M_p, *pcVar1 != '/')) || (pcVar1[1] != '/')) ||
     (pcVar1[2] == 0x2f)) {
LAB_0011fa55:
    sVar4 = 0;
  }
  else {
    iVar3 = isprint((int)pcVar1[2]);
    if (iVar3 == 0) goto LAB_0011fa55;
    sVar4 = std::__cxx11::string::find((char)this,0x2f);
    if (sVar4 == 0xffffffffffffffff) {
      sVar4 = (this->_path)._M_string_length;
    }
  }
  if (((2 < (this->_path)._M_string_length) &&
      (pcVar1 = (this->_path)._M_dataplus._M_p, *pcVar1 == '/')) &&
     ((pcVar1[1] == '/' && (pcVar1[2] != 0x2f)))) {
    iVar3 = isprint((int)pcVar1[2]);
    if (iVar3 != 0) {
      uVar5 = std::__cxx11::string::find((char)this,0x2f);
      if (uVar5 == 0xffffffffffffffff) {
        uVar5 = (this->_path)._M_string_length;
      }
      goto LAB_0011fa9f;
    }
  }
  uVar5 = 0;
LAB_0011fa9f:
  uVar2 = (this->_path)._M_string_length;
  if (uVar5 < uVar2) {
    uVar5 = (ulong)((this->_path)._M_dataplus._M_p[uVar5] == '/');
  }
  else {
    uVar5 = 0;
  }
  return uVar5 + sVar4 < uVar2;
}

Assistant:

GHC_INLINE bool path::has_relative_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    return rootPathLen < _path.length();
}